

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O3

int fy_atom_iter_utf8_quoted_get(fy_atom_iter *iter,size_t *lenp,uint8_t *buf)

{
  ssize_t sVar1;
  ulong uVar2;
  uint uVar3;
  uint left;
  ulong count;
  int ww;
  int local_34;
  
  if (buf == (uint8_t *)0x0 || (lenp == (size_t *)0x0 || iter == (fy_atom_iter *)0x0)) {
    return -1;
  }
  if (*lenp < 4) {
    return -1;
  }
  uVar3 = iter->unget_c;
  if (uVar3 != 0xffffffff) {
    iter->unget_c = -1;
    *lenp = 0;
    return uVar3 & 0xff;
  }
  sVar1 = fy_atom_iter_read(iter,buf,1);
  if (sVar1 != 1) {
    return -1;
  }
  uVar3 = (uint)*buf;
  if (-1 < (char)*buf) {
LAB_0013fa7b:
    *lenp = 0;
    return uVar3;
  }
  left = 2;
  if ((((uVar3 & 0xffffffe0) == 0xc0) || (left = 3, (uVar3 & 0xfffffff0) == 0xe0)) ||
     (left = 4, (uVar3 & 0xfffffff8) == 0xf0)) {
    count = (ulong)(left - 1);
    uVar2 = fy_atom_iter_read(iter,buf + 1,count);
    if (uVar2 != count) {
      if ((long)count <= (long)uVar2 || uVar2 == 0xffffffffffffffff) {
        return 0;
      }
      *lenp = *lenp + uVar2;
      return 0;
    }
    uVar3 = (uint)(char)*buf;
    if ((-1 < (char)*buf) || (uVar3 = fy_utf8_get_generic(buf,left,&local_34), -1 < (int)uVar3))
    goto LAB_0013fa7b;
    *lenp = (ulong)left;
  }
  else {
    *lenp = 1;
  }
  return 0;
}

Assistant:

int fy_atom_iter_utf8_quoted_get(struct fy_atom_iter *iter, size_t *lenp, uint8_t *buf) {
    ssize_t nread;
    int c, w, ww;

    if (!iter || !lenp || !buf || *lenp < 4)
        return -1;

    /* first try the pushed ungetc */
    if (iter->unget_c != -1) {
        c = iter->unget_c;
        iter->unget_c = -1;
        *lenp = 0;
        return c & 0xff;
    }

    /* read first octet */
    nread = fy_atom_iter_read(iter, &buf[0], 1);
    if (nread != 1)
        return -1;

    /* get width from it (0 means illegal) - return it and mark it */
    w = fy_utf8_width_by_first_octet(buf[0]);
    if (!w) {
        *lenp = 1;
        return 0;
    }

    /* read the rest octets (if possible) */
    if (w > 1) {
        nread = fy_atom_iter_read(iter, buf + 1, w - 1);
        if (nread != (w - 1)) {
            if (nread != -1 && nread < (w - 1))
                *lenp += nread;
            return 0;
        }
    }

    /* and return the decoded utf8 character */
    c = fy_utf8_get(buf, w, &ww);
    if (c >= 0) {
        *lenp = 0;
        return c;
    }
    *lenp = w;
    return 0;
}